

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesSystemEnvironment(cmFindPackageCommand *this)

{
  pointer pbVar1;
  bool bVar2;
  mapped_type *searchPath;
  string *i;
  pointer path;
  string_view str;
  string_view str_00;
  string debugBuffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  searchPath = std::
               map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
               ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                            &cmFindCommon::PathLabel::SystemEnvironment);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::GetPath(&local_68,(char *)0x0);
  pbVar1 = local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  path = local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (path == pbVar1) {
      if ((this->super_cmFindCommon).DebugMode != false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,
                   "Standard system environment variables [CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH].\n"
                   ,(allocator<char> *)&local_50);
        anon_unknown.dwarf_1188922::collectPathsForDebug(&local_88,searchPath,0);
        cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                  (&local_50,&this->DebugBuffer,&local_88);
        std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      return;
    }
    str._M_str = (path->_M_dataplus)._M_p;
    str._M_len = path->_M_string_length;
    bVar2 = cmHasLiteralSuffix<5ul>(str,(char (*) [5])0x7be551);
    if (bVar2) {
LAB_003b148a:
      cmsys::SystemTools::GetFilenamePath(&local_88,path);
      cmSearchPath::AddPath(searchPath,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      str_00._M_str = (path->_M_dataplus)._M_p;
      str_00._M_len = path->_M_string_length;
      bVar2 = cmHasLiteralSuffix<6ul>(str_00,(char (*) [6])0x7eb025);
      if (bVar2) goto LAB_003b148a;
      cmSearchPath::AddPath(searchPath,path);
    }
    path = path + 1;
  } while( true );
}

Assistant:

void cmFindPackageCommand::FillPrefixesSystemEnvironment()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::SystemEnvironment];

  // Use the system search path to generate prefixes.
  // Relative paths are interpreted with respect to the current
  // working directory.
  std::vector<std::string> tmp;
  cmSystemTools::GetPath(tmp);
  for (std::string const& i : tmp) {
    // If the path is a PREFIX/bin case then add its parent instead.
    if ((cmHasLiteralSuffix(i, "/bin")) || (cmHasLiteralSuffix(i, "/sbin"))) {
      paths.AddPath(cmSystemTools::GetFilenamePath(i));
    } else {
      paths.AddPath(i);
    }
  }
  if (this->DebugMode) {
    std::string debugBuffer = "Standard system environment variables "
                              "[CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH].\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}